

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::~AllocateFreeTestInstance
          (AllocateFreeTestInstance *this)

{
  AllocateFreeTestInstance *this_local;
  
  ~AllocateFreeTestInstance(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

AllocateFreeTestInstance		(Context& context, const TestConfig config)
		: TestInstance			(context)
		, m_config				(config)
		, m_result				(m_context.getTestContext().getLog())
		, m_memoryTypeIndex		(0)
		, m_memoryProperties	(getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()))
	{
		DE_ASSERT(!!m_config.memorySize != !!m_config.memoryPercentage);
	}